

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_format(char *buffer,int buffer_size,char *format,...)

{
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  va_list ap;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                 (char *)0x253c9e);
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x18;
  local_18 = &stack0xffffffffffffff08;
  vsnprintf(in_RDI,(long)in_ESI,in_RDX,&local_28);
  in_RDI[in_ESI + -1] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void str_format(char *buffer, int buffer_size, const char *format, ...)
{
	va_list ap;
	dbg_assert(buffer_size > 0, "buffer_size invalid");
	va_start(ap, format);

#if defined(CONF_FAMILY_WINDOWS) && !defined(__GNUC__)
	_vsprintf_p(buffer, buffer_size, format, ap);
#else
	vsnprintf(buffer, buffer_size, format, ap);
#endif

	va_end(ap);

	buffer[buffer_size-1] = 0; /* assure null termination */
}